

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

uint8_t * google::protobuf::internal::PrimitiveTypeHelper<17>::SerializeToArray
                    (void *ptr,uint8_t *buffer)

{
  bool bVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = *ptr >> 0x1f ^ *ptr * 2;
  *buffer = (byte)uVar3;
  if (uVar3 < 0x80) {
    return buffer + 1;
  }
  *buffer = (byte)uVar3 | 0x80;
  buffer[1] = (uint8_t)(uVar3 >> 7);
  puVar2 = buffer + 2;
  if (0x3fff < uVar3) {
    uVar4 = (uint)buffer[1];
    uVar3 = uVar3 >> 7;
    do {
      puVar2[-1] = (byte)uVar4 | 0x80;
      uVar4 = uVar3 >> 7;
      *puVar2 = (uint8_t)uVar4;
      puVar2 = puVar2 + 1;
      bVar1 = 0x3fff < uVar3;
      uVar3 = uVar4;
    } while (bVar1);
  }
  return puVar2;
}

Assistant:

static uint8_t* SerializeToArray(const void* ptr, uint8_t* buffer) {
    return WireFormatLite::WriteSInt32NoTagToArray(Get<Type>(ptr), buffer);
  }